

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O3

uint32_t ect_predict(ect *e,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  ulong uVar2;
  uint64_t uVar3;
  ulong uVar4;
  int iVar5;
  uint32_t uVar6;
  ulong uVar8;
  size_t sVar9;
  uint uVar7;
  
  uVar6 = 1;
  if (e->k != 1) {
    (ec->l).cs.costs._begin = (wclass *)0x7f7fffff;
    (ec->l).simple.initial = 0.0;
    sVar9 = e->tree_height;
    uVar4 = 0;
    while (uVar8 = uVar4, sVar9 != 0) {
      sVar9 = sVar9 - 1;
      uVar2 = 1L << (sVar9 & 0x3f);
      uVar4 = uVar8;
      if ((uVar8 | uVar2) <= e->errors) {
        iVar5 = ((uint)uVar8 | 1 << ((uint)sVar9 & 0x1f)) + e->last_pair + -1;
        puVar1 = &(ec->super_example_predict).ft_offset;
        *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar5);
        (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
        puVar1 = &(ec->super_example_predict).ft_offset;
        *puVar1 = *puVar1 - (ulong)(uint)(iVar5 * *(int *)(base + 0xe0));
        uVar4 = uVar8 | uVar2 & 0xffffffff;
        if ((ec->pred).scalar < e->class_boundary || (ec->pred).scalar == e->class_boundary) {
          uVar4 = uVar8;
        }
      }
    }
    uVar4 = e->k;
    uVar7 = (e->final_nodes)._begin[uVar8];
    uVar8 = (ulong)uVar7;
    if (uVar4 <= uVar8) {
      uVar3 = (ec->super_example_predict).ft_offset;
      do {
        iVar5 = (int)uVar8 - (int)uVar4;
        (ec->super_example_predict).ft_offset = (uint)(*(int *)(base + 0xe0) * iVar5) + uVar3;
        (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
        uVar3 = (ec->super_example_predict).ft_offset - (ulong)(uint)(iVar5 * *(int *)(base + 0xe0))
        ;
        (ec->super_example_predict).ft_offset = uVar3;
        uVar7 = (&(e->directions)._begin[uVar8].left)
                [e->class_boundary <= (ec->pred).scalar && (ec->pred).scalar != e->class_boundary];
        uVar8 = (ulong)uVar7;
        uVar4 = e->k;
      } while (uVar4 <= uVar8);
    }
    uVar6 = uVar7 + 1;
  }
  return uVar6;
}

Assistant:

uint32_t ect_predict(ect& e, single_learner& base, example& ec)
{
  if (e.k == (size_t)1)
    return 1;

  uint32_t finals_winner = 0;

  // Binary final elimination tournament first
  ec.l.simple = {FLT_MAX, 0., 0.};

  for (size_t i = e.tree_height - 1; i != (size_t)0 - 1; i--)
  {
    if ((finals_winner | (((size_t)1) << i)) <= e.errors)
    {
      // a real choice exists
      uint32_t problem_number = e.last_pair + (finals_winner | (((uint32_t)1) << i)) - 1;  // This is unique.

      base.learn(ec, problem_number);

      if (ec.pred.scalar > e.class_boundary)
        finals_winner = finals_winner | (((size_t)1) << i);
    }
  }

  uint32_t id = e.final_nodes[finals_winner];
  while (id >= e.k)
  {
    base.learn(ec, id - e.k);

    if (ec.pred.scalar > e.class_boundary)
      id = e.directions[id].right;
    else
      id = e.directions[id].left;
  }
  return id + 1;
}